

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>
::~raw_hash_set(raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>
                *this)

{
  raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>
  *this_local;
  
  destroy_slots(this);
  std::
  tuple<unsigned_long,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>::
  ~tuple(&this->settings_);
  return;
}

Assistant:

~raw_hash_set() { destroy_slots(); }